

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O1

string * agge::tests::RendererParallelTests::__suite_id_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"88","");
  std::operator+(&local_40,&local_60,&local_80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"RendererParallelTests","");
  std::operator+(in_RDI,&local_40,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

test( SingleThreadedRenderingIsDoneInSingleThread )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 2, 0, -0x03 }, { 4, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 1, 0, 0xAB }, { 2, 0, -0x1E }, { 5, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				mocks::mask_full<8> mask(cells, 1);
				mocks::bitmap<uint16_t> bitmap(5, 4);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				renderer_parallel r(1);

				// ACT
				r(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint16_t reference[] = {
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
					0x0011, 0x0011, 0x000E, 0x000E, 0x0000,
					0x0000, 0x00AB, 0x008D, 0x008D, 0x008D,
					0x0000, 0x00A0, 0x00A0, 0x00A0, 0x00A0,
				};

				assert_equal(reference, bitmap.data);
			}